

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_dd8::ByteSwap<long_double>::Run
          (ByteSwap<long_double> *this,istream *input_stream)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uchar *in_RSI;
  long in_RDI;
  uchar *p;
  int offset;
  int address;
  longdouble data;
  int c;
  int i;
  uchar tmp;
  int skip_size;
  int data_size;
  streamoff in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  undefined2 in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7f;
  uchar *in_stack_ffffffffffffff80;
  bool local_71;
  int local_60;
  int local_5c;
  unkbyte10 local_58;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  
  local_5c = *(int *)(in_RDI + 8) + *(int *)(in_RDI + 0xc) * 0x10;
  if (in_RSI == (uchar *)&std::cin) {
    local_28 = 0;
    while( true ) {
      local_71 = false;
      if (local_28 < local_5c) {
        local_71 = sptk::ReadStream<unsigned_char>
                             ((uchar *)CONCAT17(in_stack_ffffffffffffff7f,
                                                CONCAT52(in_stack_ffffffffffffff7a,
                                                         in_stack_ffffffffffffff78)),
                              (istream *)
                              CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70));
      }
      if (local_71 == false) break;
      local_28 = local_28 + 1;
    }
  }
  else {
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    std::istream::seekg(in_RSI,local_38,local_30);
    in_stack_ffffffffffffff80 = in_RSI;
  }
  iVar2 = std::istream::peek();
  if ((iVar2 != -1) && (uVar3 = std::ios::fail(), (uVar3 & 1) == 0)) {
    local_60 = *(int *)(in_RDI + 0xc);
    while( true ) {
      if (((*(int *)(in_RDI + 0x10) == -1) ||
          (in_stack_ffffffffffffff7f = false, local_5c <= *(int *)(in_RDI + 0x10))) &&
         ((*(int *)(in_RDI + 0x14) == -1 ||
          (in_stack_ffffffffffffff7f = false, local_60 <= *(int *)(in_RDI + 0x14))))) {
        in_stack_ffffffffffffff7f =
             sptk::ReadStream<long_double>
                       ((longdouble *)
                        CONCAT17(in_stack_ffffffffffffff7f,
                                 CONCAT52(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78)),
                        (istream *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70));
      }
      if ((bool)in_stack_ffffffffffffff7f == false) {
        return true;
      }
      std::reverse<unsigned_char*>
                (in_stack_ffffffffffffff80,
                 (uchar *)CONCAT17(in_stack_ffffffffffffff7f,
                                   CONCAT52(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78)));
      in_stack_ffffffffffffff70 = (undefined2)((unkuint10)local_58 >> 0x40);
      bVar1 = sptk::WriteStream<long_double>
                        ((longdouble)
                         CONCAT28(in_stack_ffffffffffffff78,
                                  CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
                         (ostream *)local_58);
      if (!bVar1) break;
      local_5c = local_5c + 0x10;
      local_60 = local_60 + 1;
    }
  }
  return false;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    // Skip data.
    const int data_size(static_cast<int>(sizeof(T)));
    const int skip_size(start_address_ + data_size * start_offset_);
    if (&std::cin == input_stream) {
      unsigned char tmp;
      int i(0);
      while (i < skip_size && sptk::ReadStream(&tmp, input_stream)) {
        ++i;
      }
    } else {
      input_stream->seekg(skip_size);
    }
    const int c(input_stream->peek());
    if (EOF == c || input_stream->fail()) {
      return false;
    }

    // Swap data.
    T data;
    for (int address(skip_size), offset(start_offset_);
         (kMagicNumberForEnd == end_address_ || address <= end_address_) &&
         (kMagicNumberForEnd == end_offset_ || offset <= end_offset_) &&
         sptk::ReadStream(&data, input_stream);
         address += data_size, ++offset) {
      unsigned char* p(reinterpret_cast<unsigned char*>(&data));
      std::reverse(p, p + data_size);
      if (!sptk::WriteStream(data, &std::cout)) {
        return false;
      }
    }

    return true;
  }